

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16(uint16_t *data,uint32_t len,uint32_t *flags)

{
  if (len < 0x20) {
    pospopcnt_u16_sse_sad(data,len,flags);
  }
  else if (len < 0x100) {
    pospopcnt_u16_sse_blend_popcnt_unroll8(data,len,flags);
  }
  else if (len < 0x200) {
    pospopcnt_u16_avx512bw_blend_popcnt_unroll8(data,len,flags);
  }
  else if (len < 0x1000) {
    pospopcnt_u16_avx512bw_adder_forest(data,len,flags);
  }
  else {
    pospopcnt_u16_avx512bw_harvey_seal(data,len,flags);
  }
  return 0;
}

Assistant:

int pospopcnt_u16(const uint16_t* data, uint32_t len, uint32_t* flags) {
#if POSPOPCNT_SIMD_VERSION >= 6
    if (len < 32) return(pospopcnt_u16_sse_sad(data, len, flags)); // small
    else if (len < 256)  return(pospopcnt_u16_sse_blend_popcnt_unroll8(data, len, flags)); // small
    else if (len < 512)  return(pospopcnt_u16_avx512bw_blend_popcnt_unroll8(data, len, flags)); // medium
    else if (len < 4096) return(pospopcnt_u16_avx512bw_adder_forest(data, len, flags)); // medium3
    else return(pospopcnt_u16_avx512_harvey_seal(data, len, flags)); // fix
#elif POSPOPCNT_SIMD_VERSION >= 5
    if (len < 128) return(pospopcnt_u16_sse_sad(data, len, flags)); // small
    else if (len < 1024) return(pospopcnt_u16_avx2_blend_popcnt_unroll8(data, len, flags)); // medium
    else return(pospopcnt_u16_avx2_harvey_seal(data, len, flags)); // large
#elif POSPOPCNT_SIMD_VERSION >= 3
    return(pospopcnt_u16_sse_harvey_seal(data, len, flags));
#else
    #ifndef _MSC_VER
        return(pospopcnt_u16_scalar_umul128_unroll2(data, len, flags)); // fallback scalar
    #else
        return(pospopcnt_u16_scalar_naive(data, len, flags));
    #endif
#endif
}